

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::ByteSizeLong(VisionFeaturePrint *this)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  
  if (this->_oneof_case_[0] == 0x15) {
    sVar3 = VisionFeaturePrint_Objects::ByteSizeLong((this->VisionFeaturePrintType_).objects_);
    uVar4 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar1 * 9 + 0x49U >> 6) + 2;
  }
  else if (this->_oneof_case_[0] == 0x14) {
    uVar4 = ((this->VisionFeaturePrintType_).scene_)->version_;
    if (uVar4 == 0) {
      uVar2 = 0;
    }
    else if ((int)uVar4 < 0) {
      uVar2 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar2 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    ((this->VisionFeaturePrintType_).scene_)->_cached_size_ = (int)uVar2;
    sVar3 = uVar2 + 3;
  }
  else {
    sVar3 = 0;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t VisionFeaturePrint::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  size_t total_size = 0;

  switch (VisionFeaturePrintType_case()) {
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene scene = 20;
    case kScene: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *VisionFeaturePrintType_.scene_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects objects = 21;
    case kObjects: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *VisionFeaturePrintType_.objects_);
      break;
    }
    case VISIONFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}